

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

pair<BigNum,_BigNum> * pairDivMod(pair<BigNum,_BigNum> *__return_storage_ptr__,BigNum *a,BigNum *b)

{
  ulong uVar1;
  bool bVar2;
  int b_00;
  ulong uVar3;
  BigNum *this;
  int iVar4;
  int iVar5;
  BigNum z;
  BigNum current;
  BigNum result;
  BigNum local_270;
  BigNum local_250;
  BigNum local_230;
  BigNum local_210;
  BigNum local_1f0;
  BigNum local_1d0;
  BigNum local_1b0;
  BigNum local_190;
  BigNum local_170;
  BigNum local_150;
  BigNum local_130;
  BigNum local_110;
  BigNum local_f0;
  BigNum local_d0;
  BigNum local_b0;
  BigNum local_90;
  BigNum local_70;
  BigNum local_50;
  
  BigNum::BigNum(&z,0);
  BigNum::BigNum(&result,0);
  uVar1 = (ulong)(uint)a->length;
  do {
    do {
      uVar3 = uVar1;
      iVar4 = (int)uVar3;
      if (iVar4 < 1) {
        std::pair<BigNum,_BigNum>::pair<BigNum_&,_BigNum_&,_true>(__return_storage_ptr__,&result,&z)
        ;
LAB_0010280a:
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&result);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&z);
        return __return_storage_ptr__;
      }
      uVar1 = uVar3 - 1;
    } while (a->length < iVar4);
    BigNum::BigNum(&local_d0,a);
    BigNum::BigNum(&local_50,b);
    bVar2 = operator<(&local_d0,&local_50);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_50);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_d0);
    if (bVar2) {
      std::pair<BigNum,_BigNum>::pair<BigNum_&,_BigNum_&,_true>(__return_storage_ptr__,&result,a);
      goto LAB_0010280a;
    }
    BigNum::BigNum(&local_110,&z);
    operator*(&local_f0,&local_110,10);
    operator+(&current,&local_f0,
              (a->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3 - 1]);
    BigNum::operator=(&z,&current);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&current);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_f0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_110);
    if (z.length < b->length) {
LAB_001025de:
      BigNum::BigNum(&local_170,&result);
      operator*(&current,&local_170,10);
      BigNum::operator=(&result,&current);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&current);
      this = &local_170;
    }
    else {
      BigNum::BigNum(&local_230,&z);
      abs((int)&local_130);
      BigNum::BigNum(&local_150,b);
      abs((int)&local_70);
      bVar2 = operator<(&local_130,&local_70);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_150);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_130);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_230);
      if (bVar2) goto LAB_001025de;
      BigNum::BigNum(&local_190,&z);
      BigNum::BigNum(&local_90,b);
      b_00 = search(&local_190,&local_90);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_190);
      BigNum::BigNum(&local_b0,b);
      operator*(&current,&local_b0,b_00);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_b0);
      BigNum::BigNum(&local_270,&z);
      BigNum::BigNum(&local_1b0,&current);
      operator-(&local_250,&local_270,&local_1b0);
      BigNum::operator=(&z,&local_250);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_250);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_1b0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_270);
      for (iVar5 = 1; iVar4 != iVar5; iVar5 = iVar5 + 1) {
        BigNum::BigNum(&local_1d0,&current);
        operator*(&local_250,&local_1d0,10);
        BigNum::operator=(&current,&local_250);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_250);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_1d0);
      }
      BigNum::BigNum(&local_210,&result);
      operator*(&local_1f0,&local_210,10);
      operator+(&local_250,&local_1f0,b_00);
      BigNum::operator=(&result,&local_250);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_250);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_1f0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_210);
      this = &current;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)this);
  } while( true );
}

Assistant:

std::pair<BigNum, BigNum> pairDivMod(BigNum a, BigNum b){
    BigNum z = BigNum(0);
    BigNum result = BigNum(0);
    for (int i = a.length - 1; i >= 0; i--) {
        if(i >= a.length)
            continue;
        if(a < b)
            return  {result, a};
        z = z * 10 + a.digits[i];
        if (z.length < b.length || abs(z) < abs(b)) {
            result = result * 10;
            continue;
        }
        int midresult = search(z, b);
        BigNum current = b * midresult;
        z = z - current;
        for (int j = 0; j < i; j++){
            current = current * 10;
        }
        result = result * 10 + midresult;
    }
    return  {result, z};
}